

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_tuple_primitive_uncheckedSlotAt
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  size_t slotIndex;
  
  if (argumentCount != 2) {
    context = (sysbvm_context_t *)0x2;
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  slotIndex = arguments[1] >> 4;
  if ((arguments[1] & 0xf) == 0) {
    slotIndex = 0;
  }
  sVar1 = sysbvm_tuple_uncheckedSlotAt(context,*arguments,slotIndex);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_uncheckedSlotAt(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    return sysbvm_tuple_uncheckedSlotAt(context, arguments[0], sysbvm_tuple_anySize_decode(arguments[1]));
}